

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void perf_get_interest_points
               (_func_void_fasthessian_ptr_vector<interest_point,_std::allocator<interest_point>_>_ptr
                *function,fasthessian *fh,benchmark_data *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  pointer piVar4;
  pointer piVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> cycleslist;
  vector<interest_point,_std::allocator<interest_point>_> dummy_interest_points_1;
  double local_a0;
  vector<interest_point,_std::allocator<interest_point>_> local_98;
  benchmark_data *local_80;
  double local_78;
  double local_70;
  vector<interest_point,_std::allocator<interest_point>_> local_68;
  long local_48;
  double local_40;
  long local_38;
  
  dVar11 = 1.0;
  lVar9 = 100;
  local_80 = data;
  do {
    local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar9 = (long)(dVar11 * (double)lVar9);
    local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              (&local_98,*(int *)(local_80 + 0x208) * lVar9);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    for (lVar7 = lVar9; lVar7 != 0; lVar7 = lVar7 + -1) {
      (*function)(fh,&local_98);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    if (local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    auVar10 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (uVar2 & 0xffffffff) +
                                 (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) -
                                 (uVar1 & 0xffffffff)) + (uVar2 & 0xffffffff00000000));
    dVar11 = auVar10._0_8_;
    local_78 = dVar11;
    if (local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    dVar11 = 100000000.0 / dVar11;
  } while (2.0 < dVar11);
  lVar7 = 0;
  local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = (double)lVar9;
  local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = 0.0;
  local_38 = lVar9;
  do {
    local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              (&local_68,*(int *)(local_80 + 0x208) * lVar9);
    cpuid_basic_info(0);
    uVar6 = rdtsc();
    local_70 = (double)CONCAT44(local_70._4_4_,(int)uVar6);
    local_48 = lVar7;
    for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
      (*function)(fh,&local_68);
    }
    uVar1 = rdtsc();
    cpuid_basic_info(0);
    if (local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    auVar10 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (uVar1 & 0xffffffff) +
                                 (((ulong)(uint)-(int)((ulong)uVar6 >> 0x20) << 0x20) -
                                 ((ulong)local_70 & 0xffffffff)) + (uVar1 & 0xffffffff00000000));
    local_78 = auVar10._0_8_ / local_40;
    local_70 = local_78;
    if (local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_98,
                 (iterator)
                 local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_78);
    }
    else {
      *(double *)
       local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
       super__Vector_impl_data._M_finish = local_78;
      local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((long)local_98.
                           super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 8);
    }
    lVar7 = local_48;
    if (local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    piVar5 = local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar4 = local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = lVar7 + 1;
    local_a0 = local_a0 + local_70;
  } while (lVar7 != 10);
  local_a0 = local_a0 / 10.0;
  lVar9 = *(long *)(local_80 + 0x210);
  local_78 = local_a0;
  if (local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_98.
                                  super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_98.
                                  super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar4,piVar5);
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_78;
  auVar13._0_8_ = ((double)lVar9 * 100.0) / local_a0;
  auVar13._8_8_ = 0;
  auVar15._8_8_ = 0x3fdfffffffffffff;
  auVar15._0_8_ = 0x3fdfffffffffffff;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar10 = vpternlogq_avx512vl(auVar15,auVar13,auVar3,0xf8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar13._0_8_ + auVar10._0_8_;
  auVar3 = vroundsd_avx(auVar14,auVar14,0xb);
  auVar10 = vmovhpd_avx(auVar12,*(double *)
                                 local_98.
                                 super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
  auVar10 = vcvttpd2uqq_avx512vl(auVar10);
  *(undefined1 (*) [16])(local_80 + 0x218) = auVar10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(ulong *)(local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].descriptor + 0x3e);
  uVar6 = vcvttsd2usi_avx512f(auVar10);
  *(undefined8 *)(local_80 + 0x228) = uVar6;
  *(double *)(local_80 + 0x230) = auVar3._0_8_ / 100.0;
  operator_delete(local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_98.super__Vector_base<interest_point,_std::allocator<interest_point>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void perf_get_interest_points(void (*function)(struct fasthessian *, std::vector<struct interest_point> *),
                              struct fasthessian *fh, struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);
        dummy_interest_points.clear();

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();

        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);

        dummy_interest_points.clear();

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}